

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O2

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::UnaryAssertionExpr>
          (ASTSerializer *this,UnaryAssertionExpr *elem,bool inMembersArray)

{
  SyntaxNode *this_00;
  SourceManager *this_01;
  SourceLocation location;
  SourceLocation location_00;
  size_t sVar1;
  SourceRange SVar2;
  string_view sVar3;
  
  JsonWriter::startObject(this->writer);
  this_00 = (elem->super_AssertionExpr).syntax;
  if (((this_00 != (SyntaxNode *)0x0) && (this->includeSourceInfo == true)) &&
     (this_01 = this->compilation->sourceManager, this_01 != (SourceManager *)0x0)) {
    SVar2 = slang::syntax::SyntaxNode::sourceRange(this_00);
    location = SourceManager::getFullyExpandedLoc(this_01,SVar2.startLoc);
    location_00 = SourceManager::getFullyExpandedLoc(this_01,SVar2.endLoc);
    sVar3 = SourceManager::getFileName(this_01,location);
    write(this,0x11,"source_file_start",sVar3._M_len);
    sVar3 = SourceManager::getFileName(this_01,location_00);
    write(this,0xf,"source_file_end",sVar3._M_len);
    sVar1 = SourceManager::getLineNumber(this_01,location);
    write(this,0x11,"source_line_start",sVar1);
    sVar1 = SourceManager::getLineNumber(this_01,location_00);
    write(this,0xf,"source_line_end",sVar1);
    sVar1 = SourceManager::getColumnNumber(this_01,location);
    write(this,0x13,"source_column_start",sVar1);
    sVar1 = SourceManager::getColumnNumber(this_01,location_00);
    write(this,0x11,"source_column_end",sVar1);
  }
  sVar3 = ast::toString((elem->super_AssertionExpr).kind);
  write(this,4,"kind",sVar3._M_len);
  UnaryAssertionExpr::serializeTo(elem,this);
  JsonWriter::endObject(this->writer);
  return;
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    if constexpr (std::is_base_of_v<Expression, T> || std::is_base_of_v<Statement, T> ||
                  std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                  std::is_base_of_v<AssertionExpr, T> || std::is_base_of_v<BinsSelectExpr, T> ||
                  std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        if (elem.syntax && includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                auto sr = elem.syntax->sourceRange();
                auto start = sm->getFullyExpandedLoc(sr.start());
                auto end = sm->getFullyExpandedLoc(sr.end());
                write("source_file_start", sm->getFileName(start));
                write("source_file_end", sm->getFileName(end));
                write("source_line_start", sm->getLineNumber(start));
                write("source_line_end", sm->getLineNumber(end));
                write("source_column_start", sm->getColumnNumber(start));
                write("source_column_end", sm->getColumnNumber(end));
            }
        }
    }
    if constexpr (std::is_base_of_v<Expression, T>) {
        write("kind", toString(elem.kind));
        write("type", *elem.type);
        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        if (tryConstantFold) {
            ASTContext ctx(compilation.getRoot(), LookupLocation::max);
            ConstantValue constant = ctx.tryEval(elem);
            if (constant)
                write("constant", constant);
        }
        else if (elem.constant) {
            write("constant", *elem.constant);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        write("kind", toString(elem.kind));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            // If we're not including detailed type info, we can just write the type name,
            // unless this a type alias, class, or covergroup. Otherwise we will fall through
            // and serialize full detailed type info.
            if (!detailedTypeInfo && (!inMembersArray || (!std::is_same_v<TypeAliasType, T> &&
                                                          !std::is_same_v<ClassType, T> &&
                                                          !std::is_same_v<CovergroupType, T>))) {
                writer.writeValue(elem.toString());
                return;
            }

            // Avoid infinite loops with recursive types.
            if (!visiting.insert(&elem).second) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Skip uninstantiated blocks and instances.
        if constexpr (std::is_same_v<InstanceSymbol, T> ||
                      std::is_same_v<CheckerInstanceSymbol, T>) {
            if (elem.body.flags.has(InstanceFlags::Uninstantiated))
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockArraySymbol, T>) {
            if (!elem.valid)
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockSymbol, T>) {
            if (elem.isUninstantiated)
                return;
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::BuiltIn | MethodFlags::Randomize))
                return;
        }

        // Ignore transparent members.
        if (elem.kind == SymbolKind::TransparentMember)
            return;

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));
        if (includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                write("source_file", sm->getFileName(elem.location));
                write("source_line", sm->getLineNumber(elem.location));
                write("source_column", sm->getColumnNumber(elem.location));
            }
        }

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            if (elem.kind != SymbolKind::EnumValue)
                write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();

        if constexpr (std::is_base_of_v<Type, T>) {
            visiting.erase(&elem);
        }
    }
}